

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

string<char> __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::replaceSpecialCharacters
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,string<char> *origstr)

{
  bool bVar1;
  _func_int **pp_Var2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  string<char> *in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  int iVar7;
  ulong uVar8;
  long lVar9;
  s32 begin;
  long lVar10;
  string<char> sVar11;
  string<char> *newstr;
  string<char> local_58;
  int local_44;
  long local_40;
  ulong local_38;
  
  uVar8 = 0xffffffff;
  if (0 < (long)in_RDX->used) {
    uVar4 = 0;
    do {
      if (in_RDX->array[uVar4] == '&') {
        uVar8 = uVar4 & 0xffffffff;
        break;
      }
      uVar4 = uVar4 + 1;
    } while ((long)in_RDX->used != uVar4);
  }
  if ((int)uVar8 == -1) {
    (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = (_func_int **)0x0;
    this->TextData = (char *)0x0;
    core::string<char>::operator=((string<char> *)this,in_RDX);
    uVar4 = extraout_RDX_01;
  }
  else {
    (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = (_func_int **)0x0;
    this->TextData = (char *)0x100000001;
    pp_Var2 = (_func_int **)operator_new__(1);
    (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = pp_Var2;
    *(undefined1 *)pp_Var2 = 0;
    uVar4 = 0;
    do {
      iVar7 = (int)uVar8;
      begin = (s32)in_RDX;
      if (in_RDX->used + -3 <= iVar7) break;
      local_40 = (long)iVar7;
      uVar6 = 0xffffffff;
      local_44 = iVar7;
      local_38 = uVar4;
      if (0 < *(int *)((long)&origstr[6].array + 4)) {
        lVar9 = 0;
        lVar10 = 0;
        do {
          bVar1 = equalsn((CXMLReaderImpl<char,_irr::io::IXMLBase> *)origstr,
                          (char *)(*(long *)(*(long *)&origstr[5].allocated + lVar9) + 1),
                          in_RDX->array + local_40 + 1,
                          *(int *)(*(long *)&origstr[5].allocated + 0xc + lVar9) + -2);
          uVar6 = (uint)lVar10;
          if (bVar1) break;
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0x10;
          uVar6 = 0xffffffff;
        } while (lVar10 < *(int *)((long)&origstr[6].array + 4));
      }
      iVar7 = local_44;
      if (uVar6 == 0xffffffff) {
        core::string<char>::subString(&local_58,begin,(s32)local_38);
        core::string<char>::append((string<char> *)this,&local_58);
        if (local_58.array != (char *)0x0) {
          operator_delete__(local_58.array);
        }
        iVar3 = 1;
      }
      else {
        core::string<char>::subString(&local_58,begin,(s32)local_38);
        core::string<char>::append((string<char> *)this,&local_58);
        if (local_58.array != (char *)0x0) {
          operator_delete__(local_58.array);
        }
        core::string<char>::append
                  ((string<char> *)this,
                   **(char **)(*(long *)&origstr[5].allocated + (ulong)uVar6 * 0x10));
        iVar3 = *(int *)(*(long *)&origstr[5].allocated + 0xc + (ulong)uVar6 * 0x10) + -1;
      }
      uVar6 = iVar7 + iVar3;
      uVar4 = (ulong)uVar6;
      uVar8 = 0xffffffff;
      if ((int)uVar6 < in_RDX->used) {
        pcVar5 = in_RDX->array + iVar3 + local_40;
        do {
          if (*pcVar5 == '&') {
            uVar8 = (ulong)uVar6;
            break;
          }
          uVar6 = uVar6 + 1;
          pcVar5 = pcVar5 + 1;
        } while (in_RDX->used != uVar6);
      }
    } while ((int)uVar8 != -1);
    if ((s32)uVar4 < in_RDX->used + -2) {
      core::string<char>::subString(&local_58,begin,(s32)uVar4);
      core::string<char>::append((string<char> *)this,&local_58);
      uVar4 = extraout_RDX;
      if (local_58.array != (char *)0x0) {
        operator_delete__(local_58.array);
        uVar4 = extraout_RDX_00;
      }
    }
  }
  sVar11.allocated = (int)uVar4;
  sVar11.used = (int)(uVar4 >> 0x20);
  sVar11.array = (char *)this;
  return sVar11;
}

Assistant:

core::string<char_type> replaceSpecialCharacters(
		core::string<char_type>& origstr)
	{
		int pos = origstr.findFirst(L'&');
		int oldPos = 0;

		if (pos == -1)
			return origstr;

		core::string<char_type> newstr;

		while(pos != -1 && pos < origstr.size()-2)
		{
			// check if it is one of the special characters

			int specialChar = -1;
			for (int i=0; i<(int)SpecialCharacters.size(); ++i)
			{
				const char_type* p = &origstr.c_str()[pos]+1;

				if (equalsn(&SpecialCharacters[i][1], p, SpecialCharacters[i].size()-1))
				{
					specialChar = i;
					break;
				}
			}

			if (specialChar != -1)
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos));
				newstr.append(SpecialCharacters[specialChar][0]);
				pos += SpecialCharacters[specialChar].size();
			}
			else
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos + 1));
				pos += 1;
			}

			// find next &
			oldPos = pos;
			pos = origstr.findNext(L'&', pos);		
		}

		if (oldPos < origstr.size()-1)
			newstr.append(origstr.subString(oldPos, origstr.size()-oldPos));

		return newstr;
	}